

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  byte *pbVar1;
  ushort *puVar2;
  EnumValueDescriptor *pEVar3;
  pointer pcVar4;
  FeatureSet *from;
  byte bVar5;
  bool bVar6;
  EnumValueDescriptorProto *proto_00;
  void *pvVar7;
  EnumOptions *this_00;
  EnumOptions *pEVar8;
  FeatureSet *this_01;
  Arena *pAVar9;
  char *pcVar10;
  char *extraout_RDX;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ArenaStringPtr *this_02;
  string_view value;
  
  puVar2 = (ushort *)(this->all_names_).payload_;
  uVar14 = (ulong)*puVar2;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  pcVar10 = (char *)((long)puVar2 + ~uVar14);
  this_02 = &(proto->field_0)._impl_.name_;
  pAVar9 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar9 & 1) != 0) goto LAB_0039072d;
  while( true ) {
    value._M_str = pcVar10;
    value._M_len = uVar14;
    internal::ArenaStringPtr::Set(this_02,value,pAVar9);
    if (0 < this->value_count_) {
      lVar13 = 0;
      lVar11 = 0;
      do {
        pEVar3 = this->values_;
        proto_00 = (EnumValueDescriptorProto *)
                   internal::RepeatedPtrFieldBase::AddMessageLite
                             (&(proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase,
                              Arena::DefaultConstruct<google::protobuf::EnumValueDescriptorProto>);
        EnumValueDescriptor::CopyTo
                  ((EnumValueDescriptor *)(&pEVar3->super_SymbolBaseN<0> + lVar13),proto_00);
        lVar11 = lVar11 + 1;
        lVar13 = lVar13 + 0x30;
      } while (lVar11 < this->value_count_);
    }
    if (this->reserved_range_count_ < 1) break;
    this_02 = (ArenaStringPtr *)0x0;
    while( true ) {
      pvVar7 = internal::RepeatedPtrFieldBase::AddMessageLite
                         (&(proto->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase,
                          Arena::
                          DefaultConstruct<google::protobuf::EnumDescriptorProto_EnumReservedRange>)
      ;
      uVar14 = (ulong)this->reserved_range_count_;
      if ((long)uVar14 <= (long)this_02) break;
      *(int *)((long)pvVar7 + 0x18) = this->reserved_ranges_[(long)this_02].start;
      uVar12 = *(uint *)((long)pvVar7 + 0x10);
      pAVar9 = (Arena *)(ulong)uVar12;
      *(uint *)((long)pvVar7 + 0x10) = uVar12 | 1;
      uVar14 = (ulong)this->reserved_range_count_;
      if ((long)uVar14 <= (long)this_02) goto LAB_00390720;
      *(int *)((long)pvVar7 + 0x1c) = this->reserved_ranges_[(long)this_02].end;
      pAVar9 = (Arena *)(ulong)(uVar12 | 3);
      *(uint *)((long)pvVar7 + 0x10) = uVar12 | 3;
      this_02 = (ArenaStringPtr *)((long)&(this_02->tagged_ptr_).ptr_ + 1);
      if ((long)this->reserved_range_count_ <= (long)this_02) goto LAB_003905ec;
    }
    CopyTo();
LAB_00390720:
    CopyTo();
    pcVar10 = extraout_RDX;
LAB_0039072d:
    pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
  }
LAB_003905ec:
  if (0 < this->reserved_name_count_) {
    lVar11 = 0;
    do {
      pcVar4 = (this->reserved_names_[lVar11]->_M_dataplus)._M_p;
      pvVar7 = internal::RepeatedPtrFieldBase::AddString
                         (&(proto->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase);
      std::__cxx11::string::_M_replace((ulong)pvVar7,0,*(char **)((long)pvVar7 + 8),(ulong)pcVar4);
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->reserved_name_count_);
  }
  bVar5 = (byte)this->field_0x1 >> 2;
  uVar12 = bVar5 & 3;
  if ((bVar5 & 3) != 0) {
    bVar6 = internal::ValidateEnum(uVar12,(uint32_t *)&SymbolVisibility_internal_data_);
    if (!bVar6) {
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::SymbolVisibility_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                    ,0x3e55,
                    "void google::protobuf::EnumDescriptorProto::_internal_set_visibility(::google::protobuf::SymbolVisibility)"
                   );
    }
    (proto->field_0)._impl_.visibility_ = uVar12;
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
  }
  pEVar8 = this->options_;
  if (pEVar8 != (EnumOptions *)_EnumOptions_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    this_00 = (proto->field_0)._impl_.options_;
    if (this_00 == (EnumOptions *)0x0) {
      pAVar9 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
      }
      this_00 = (EnumOptions *)Arena::DefaultConstruct<google::protobuf::EnumOptions>(pAVar9);
      (proto->field_0)._impl_.options_ = this_00;
    }
    EnumOptions::CopyFrom(this_00,pEVar8);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    pEVar8 = (proto->field_0)._impl_.options_;
    if (pEVar8 == (EnumOptions *)0x0) {
      pAVar9 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
      }
      pEVar8 = (EnumOptions *)Arena::DefaultConstruct<google::protobuf::EnumOptions>(pAVar9);
      (proto->field_0)._impl_.options_ = pEVar8;
    }
    pbVar1 = (byte *)((long)&pEVar8->field_0 + 0x18);
    *pbVar1 = *pbVar1 | 1;
    this_01 = (pEVar8->field_0)._impl_.features_;
    if (this_01 == (FeatureSet *)0x0) {
      pAVar9 = (Arena *)(pEVar8->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
      }
      this_01 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar9);
      (pEVar8->field_0)._impl_.features_ = this_01;
    }
    FeatureSet::CopyFrom(this_01,from);
    return;
  }
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    EnumDescriptorProto::EnumReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (visibility_keyword() != SymbolVisibility::VISIBILITY_UNSET) {
    proto->set_visibility(visibility_keyword());
  }

  if (&options() != &EnumOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}